

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_safe_arena.h
# Opt level: O0

void * __thiscall
google::protobuf::internal::ThreadSafeArena::
AllocateAligned<(google::protobuf::internal::AllocationClient)0>(ThreadSafeArena *this,size_t n)

{
  bool bVar1;
  SerialArena *local_28;
  SerialArena *arena;
  size_t n_local;
  ThreadSafeArena *this_local;
  
  arena = (SerialArena *)n;
  n_local = (size_t)this;
  bVar1 = GetSerialArenaFast(this,&local_28);
  if (bVar1) {
    this_local = (ThreadSafeArena *)
                 SerialArena::AllocateAligned<(google::protobuf::internal::AllocationClient)0>
                           (local_28,(size_t)arena);
  }
  else {
    this_local = (ThreadSafeArena *)
                 AllocateAlignedFallback<(google::protobuf::internal::AllocationClient)0>
                           (this,(size_t)arena);
  }
  return this_local;
}

Assistant:

void* AllocateAligned(size_t n) {
    SerialArena* arena;
    if (PROTOBUF_PREDICT_TRUE(GetSerialArenaFast(&arena))) {
      return arena->AllocateAligned<alloc_client>(n);
    } else {
      return AllocateAlignedFallback<alloc_client>(n);
    }
  }